

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

void checkformat(lua_State *L,char *form,char *flags,int precision)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  byte bVar4;
  
  sVar2 = strspn(form + 1,flags);
  bVar4 = 0x30;
  if (form[sVar2 + 1] != '0') {
    pbVar3 = (byte *)get2digits(form + sVar2 + 1);
    bVar4 = *pbVar3;
    if (precision != 0 && bVar4 == 0x2e) {
      pbVar3 = (byte *)get2digits((char *)(pbVar3 + 1));
      bVar4 = *pbVar3;
    }
  }
  iVar1 = isalpha((uint)bVar4);
  if (iVar1 != 0) {
    return;
  }
  luaL_error(L,"invalid conversion specification: \'%s\'",form);
  return;
}

Assistant:

static void checkformat (lua_State *L, const char *form, const char *flags,
                                       int precision) {
  const char *spec = form + 1;  /* skip '%' */
  spec += strspn(spec, flags);  /* skip flags */
  if (*spec != '0') {  /* a width cannot start with '0' */
    spec = get2digits(spec);  /* skip width */
    if (*spec == '.' && precision) {
      spec++;
      spec = get2digits(spec);  /* skip precision */
    }
  }
  if (!isalpha(uchar(*spec)))  /* did not go to the end? */
    luaL_error(L, "invalid conversion specification: '%s'", form);
}